

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c02d::CpuTest_plp_clears_b_and_sets_bit_5_Test::TestBody
          (CpuTest_plp_clears_b_and_sets_bit_5_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  int iVar1;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  ActionInterface<unsigned_char_(unsigned_short)> *impl;
  pointer *__ptr;
  char cVar2;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_88;
  code *local_78;
  undefined1 local_68 [8];
  MatcherBase<unsigned_short> local_60;
  MatcherBase<unsigned_short> local_48;
  int *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'(');
  (this->super_CpuTest).registers.sp = '\n';
  (this->super_CpuTest).registers.p = 0xbb;
  (this->super_CpuTest).expected.sp = '\v';
  (this->super_CpuTest).expected.p = 0xa1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_88,(this->super_CpuTest).expected.pc);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0xc1,"mmu","read_byte(expected.pc)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_88);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_48,(this->super_CpuTest).expected.sp | 0x100);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                       ,0xc2,"mmu","read_byte(kStackOffset + expected.sp)");
  local_30 = (int *)operator_new(4);
  *local_30 = 0x91;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_28,local_30);
  impl = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar1 = *local_30;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(char *)((long)&impl[1]._vptr_ActionInterface + 4) = (char)iVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,impl);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_01,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  cVar2 = '\x04';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar2 = cVar2 + -1;
  } while (cVar2 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0xc6,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_88._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, plp_clears_b_and_sets_bit_5) {
    stage_instruction(PLP);
    registers.sp = 0x0A;
    registers.p = 0xBB;

    expected.sp = registers.sp + static_cast<uint8_t>(1u);
    expected.p = static_cast<uint8_t>(FLAG_5 | C_FLAG) | N_FLAG;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(expected.pc));
    EXPECT_CALL(mmu, read_byte(kStackOffset + expected.sp))
            .WillOnce(Return(static_cast<uint8_t>(B_FLAG | C_FLAG) | N_FLAG));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}